

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEFStreamObjectHelper.cc
# Opt level: O2

QPDFEFStreamObjectHelper * __thiscall
QPDFEFStreamObjectHelper::setCreationDate(QPDFEFStreamObjectHelper *this,string *date)

{
  allocator<char> local_41;
  undefined1 local_40 [16];
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_40 + 0x10),"/CreationDate",&local_41);
  QPDFObjectHandle::newString((string *)local_40);
  setParam(this,(string *)(local_40 + 0x10),(QPDFObjectHandle *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_40 + 8));
  std::__cxx11::string::~string((string *)(local_40 + 0x10));
  return this;
}

Assistant:

QPDFEFStreamObjectHelper&
QPDFEFStreamObjectHelper::setCreationDate(std::string const& date)
{
    setParam("/CreationDate", QPDFObjectHandle::newString(date));
    return *this;
}